

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontGlyphRangesBuilder::AddRanges(ImFontGlyphRangesBuilder *this,ImWchar *ranges)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  
  uVar3 = *ranges;
  do {
    if (uVar3 == 0) {
      return;
    }
    if (uVar3 <= ranges[1]) {
      puVar2 = (this->UsedChars).Data;
      do {
        if ((this->UsedChars).Size <= (int)(uVar3 >> 5)) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.h"
                        ,0x68b,"T &ImVector<unsigned int>::operator[](int) [T = unsigned int]");
        }
        puVar1 = puVar2 + (uVar3 >> 5);
        *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
        uVar3 = uVar3 + 1;
      } while (uVar3 <= ranges[1]);
    }
    uVar3 = ranges[2];
    ranges = ranges + 2;
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (ImWchar c = ranges[0]; c <= ranges[1]; c++)
            AddChar(c);
}